

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_stack.cpp
# Opt level: O0

void use_stack(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  ulong local_70;
  unsigned_long po;
  undefined1 local_60 [7];
  char ch;
  Stack st;
  
  L10_3::Stack::Stack((Stack *)local_60);
  std::operator<<((ostream *)&std::cout,
                  "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n");
  do {
    while( true ) {
      piVar4 = std::operator>>((istream *)&std::cin,(char *)((long)&po + 7));
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      bVar2 = false;
      if (bVar1) {
        iVar3 = toupper((int)po._7_1_);
        bVar2 = iVar3 != 0x51;
      }
      if (!bVar2) {
        std::operator<<((ostream *)&std::cout,"Bye!\n");
        return;
      }
      do {
        iVar3 = std::istream::get();
      } while (iVar3 != 10);
      iVar3 = isalpha((int)po._7_1_);
      if (iVar3 != 0) break;
      std::operator<<((ostream *)&std::cout,'\a');
    }
    if (po._7_1_ == 'A') {
LAB_00111a3f:
      std::operator<<((ostream *)&std::cout,"Enter a PO number to add: ");
      std::istream::operator>>(&std::cin,&local_70);
      poVar5 = std::operator<<((ostream *)&std::cout,"You entered: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_70);
      std::operator<<(poVar5,"\n");
      bVar2 = L10_3::Stack::is_full((Stack *)local_60);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"Stack already full.\n");
      }
      else {
        L10_3::Stack::push((Stack *)local_60,&local_70);
      }
    }
    else if (po._7_1_ == 'P') {
LAB_00111ac3:
      bVar2 = L10_3::Stack::is_empty((Stack *)local_60);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"Stack already cleared.\n");
      }
      else {
        L10_3::Stack::pop((Stack *)local_60,&local_70);
        poVar5 = std::operator<<((ostream *)&std::cout,"Po #");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_70);
        std::operator<<(poVar5," processed.\n");
      }
    }
    else {
      if (po._7_1_ == 'a') goto LAB_00111a3f;
      if (po._7_1_ == 'p') goto LAB_00111ac3;
    }
    std::operator<<((ostream *)&std::cout,
                    "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n");
  } while( true );
}

Assistant:

void use_stack() {
    using namespace L10_3;
    using namespace std;

    Stack st;
    char ch;
    unsigned long po;
    cout << "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n";
    //  toupper = to upper case
    while(cin >> ch && toupper(ch) != 'Q') {
        //  接下来的一个字符是换行符，才做后面的操作
        while(cin.get() != '\n') {
            continue;
        }
        //  is alphabetic, 是否是字母
        if (!isalpha(ch)) {
            cout << '\a';
            continue;
        }
        switch(ch) {
            case 'A':
            case 'a':
                cout << "Enter a PO number to add: ";
                cin >> po;
                cout << "You entered: " << po << "\n";
                if (st.is_full()) {
                    cout << "Stack already full.\n";
                } else {
                    //  推入栈
                    st.push(po);
                }
                break;
            case 'p':
            case 'P':
                if (st.is_empty()) {
                    cout << "Stack already cleared.\n";
                } else {
                    st.pop(po);
                    cout << "Po #" << po << " processed.\n";
                }
                break;
        }
        cout << "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n";
    }
    cout << "Bye!\n";
}